

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

ScalarFunction * duckdb::SqrtFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_141;
  code *local_140 [2];
  code *local_130;
  code *local_128;
  LogicalType local_120 [24];
  LogicalType local_108 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_f0;
  LogicalType local_d8 [24];
  BaseScalarFunction local_c0 [176];
  
  duckdb::LogicalType::LogicalType(local_108,DOUBLE);
  __l._M_len = 1;
  __l._M_array = local_108;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_f0,__l,&local_141);
  duckdb::LogicalType::LogicalType(local_120,DOUBLE);
  local_140[1] = (code *)0x0;
  local_140[0] = ScalarFunction::UnaryFunction<double,double,duckdb::SqrtOperator>;
  local_128 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_d8,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_d8);
  std::_Function_base::~_Function_base((_Function_base *)local_140);
  duckdb::LogicalType::~LogicalType(local_120);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_f0);
  duckdb::LogicalType::~LogicalType(local_108);
  BaseScalarFunction::SetReturnsError(local_c0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_c0);
  return in_RDI;
}

Assistant:

ScalarFunction SqrtFun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, SqrtOperator>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}